

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::ConstantDerivateCaseInstance::verify
          (ConstantDerivateCaseInstance *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  bool bVar1;
  TestContext *this_00;
  TestLog *log;
  undefined7 extraout_var;
  Vector<float,_4> local_60;
  undefined1 local_50 [16];
  undefined1 local_40 [8];
  Vec4 threshold;
  Vec4 reference;
  PixelBufferAccess *errorMask_local;
  ConstPixelBufferAccess *result_local;
  ConstantDerivateCaseInstance *this_local;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(threshold.m_data + 2),0.0);
  TriangleDerivateCaseInstance::getSurfaceThreshold((TriangleDerivateCaseInstance *)local_50);
  tcu::abs<float,4>((tcu *)&local_60,
                    &((this->super_TriangleDerivateCaseInstance).m_values)->derivScale);
  tcu::operator/((tcu *)local_40,(Vector<float,_4> *)local_50,&local_60);
  this_00 = Context::getTestContext
                      ((this->super_TriangleDerivateCaseInstance).super_ShaderRenderCaseInstance.
                       super_TestInstance.m_context);
  log = tcu::TestContext::getLog(this_00);
  bVar1 = verifyConstantDerivate
                    (log,(ConstPixelBufferAccess *)ctx,(PixelBufferAccess *)sig,
                     ((this->super_TriangleDerivateCaseInstance).m_definitions)->dataType,
                     (Vec4 *)(threshold.m_data + 2),(Vec4 *)local_40,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->derivScale,
                     &((this->super_TriangleDerivateCaseInstance).m_values)->derivBias,LOG_ALL);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

bool ConstantDerivateCaseInstance::verify (const tcu::ConstPixelBufferAccess& result, const tcu::PixelBufferAccess& errorMask)
{
	const tcu::Vec4 reference	(0.0f); // Derivate of constant argument should always be 0
	const tcu::Vec4	threshold	= getSurfaceThreshold() / abs(m_values.derivScale);

	return verifyConstantDerivate(m_context.getTestContext().getLog(), result, errorMask, m_definitions.dataType,
								  reference, threshold, m_values.derivScale, m_values.derivBias);
}